

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

void __thiscall Assimp::Importer::Importer(Importer *this)

{
  bool bVar1;
  ImporterPimpl *this_00;
  IOSystem *this_01;
  ProgressHandler *this_02;
  SharedPostProcessInfo *this_03;
  reference ppBVar2;
  char *num_bytes;
  __normal_iterator<Assimp::BaseProcess_**,_std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>_>
  local_20;
  __normal_iterator<Assimp::BaseProcess_**,_std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>_>
  local_18;
  iterator it;
  Importer *this_local;
  
  it._M_current = (BaseProcess **)this;
  this_00 = (ImporterPimpl *)operator_new(0x148);
  ImporterPimpl::ImporterPimpl(this_00);
  this->pimpl = this_00;
  this->pimpl->mScene = (aiScene *)0x0;
  num_bytes = "";
  std::__cxx11::string::operator=((string *)&this->pimpl->mErrorString,"");
  this_01 = (IOSystem *)
            Intern::AllocateFromAssimpHeap::operator_new
                      ((AllocateFromAssimpHeap *)0x20,(size_t)num_bytes);
  DefaultIOSystem::DefaultIOSystem((DefaultIOSystem *)this_01);
  this->pimpl->mIOHandler = this_01;
  this->pimpl->mIsDefaultHandler = true;
  this->pimpl->bExtraVerbose = false;
  this_02 = (ProgressHandler *)
            Intern::AllocateFromAssimpHeap::operator_new
                      ((AllocateFromAssimpHeap *)0x8,(size_t)num_bytes);
  memset(this_02,0,8);
  DefaultProgressHandler::DefaultProgressHandler((DefaultProgressHandler *)this_02);
  this->pimpl->mProgressHandler = this_02;
  this->pimpl->mIsDefaultProgressHandler = true;
  GetImporterInstanceList(&this->pimpl->mImporter);
  GetPostProcessingStepInstanceList(&this->pimpl->mPostProcessingSteps);
  this_03 = (SharedPostProcessInfo *)operator_new(0x30);
  memset(this_03,0,0x30);
  SharedPostProcessInfo::SharedPostProcessInfo(this_03);
  this->pimpl->mPPShared = this_03;
  local_18._M_current =
       (BaseProcess **)
       std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::begin
                 (&this->pimpl->mPostProcessingSteps);
  while( true ) {
    local_20._M_current =
         (BaseProcess **)
         std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::end
                   (&this->pimpl->mPostProcessingSteps);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppBVar2 = __gnu_cxx::
              __normal_iterator<Assimp::BaseProcess_**,_std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>_>
              ::operator*(&local_18);
    BaseProcess::SetSharedData(*ppBVar2,this->pimpl->mPPShared);
    __gnu_cxx::
    __normal_iterator<Assimp::BaseProcess_**,_std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

Importer::Importer()
 : pimpl( new ImporterPimpl ) {
    pimpl->mScene = NULL;
    pimpl->mErrorString = "";

    // Allocate a default IO handler
    pimpl->mIOHandler = new DefaultIOSystem;
    pimpl->mIsDefaultHandler = true;
    pimpl->bExtraVerbose     = false; // disable extra verbose mode by default

    pimpl->mProgressHandler = new DefaultProgressHandler();
    pimpl->mIsDefaultProgressHandler = true;

    GetImporterInstanceList(pimpl->mImporter);
    GetPostProcessingStepInstanceList(pimpl->mPostProcessingSteps);

    // Allocate a SharedPostProcessInfo object and store pointers to it in all post-process steps in the list.
    pimpl->mPPShared = new SharedPostProcessInfo();
    for (std::vector<BaseProcess*>::iterator it =  pimpl->mPostProcessingSteps.begin();
        it != pimpl->mPostProcessingSteps.end();
        ++it)   {

        (*it)->SetSharedData(pimpl->mPPShared);
    }
}